

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

ssl_ticket_aead_result_t __thiscall
bssl::decrypt_ticket_with_cipher_ctx
          (bssl *this,Array<unsigned_char> *out,EVP_CIPHER_CTX *cipher_ctx,HMAC_CTX *hmac_ctx,
          Span<const_unsigned_char> ticket)

{
  Array<unsigned_char> *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t len;
  ssl_ticket_aead_result_t sVar4;
  Span<const_unsigned_char> SVar5;
  int len1;
  Array<unsigned_char> plaintext;
  int len2;
  EVP_CIPHER_CTX *local_98;
  Array<unsigned_char> *local_90;
  Span<const_unsigned_char> local_88;
  uint8_t mac [64];
  
  local_98 = (EVP_CIPHER_CTX *)out;
  local_88.data_ = (uchar *)hmac_ctx;
  local_88.size_ = (size_t)ticket.data_;
  uVar2 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)out);
  len = HMAC_size((HMAC_CTX *)cipher_ctx);
  if (ticket.data_ < (uchar *)(len + uVar2 + 0x11)) {
    return ssl_ticket_aead_ignore_ticket;
  }
  local_90 = (Array<unsigned_char> *)this;
  SVar5 = Span<const_unsigned_char>::last(&local_88,len);
  local_88 = Span<const_unsigned_char>::first(&local_88,local_88.size_ - len);
  HMAC_Update((HMAC_CTX *)cipher_ctx,local_88.data_,local_88.size_);
  HMAC_Final((HMAC_CTX *)cipher_ctx,mac,(uint *)0x0);
  if (len == SVar5.size_) {
    iVar3 = CRYPTO_memcmp(mac,SVar5.data_,len);
    if (iVar3 != 0) {
      return ssl_ticket_aead_ignore_ticket;
    }
    SVar5 = Span<const_unsigned_char>::subspan(&local_88,(ulong)uVar2 + 0x10,0xffffffffffffffff);
    plaintext.data_ = (uchar *)0x0;
    plaintext.size_ = 0;
    sVar4 = ssl_ticket_aead_ignore_ticket;
    if (SVar5.size_ < 0x7fffffff) {
      bVar1 = Array<unsigned_char>::InitUninitialized(&plaintext,SVar5.size_);
      this_00 = local_90;
      if (bVar1) {
        iVar3 = EVP_DecryptUpdate(local_98,plaintext.data_,&len1,SVar5.data_,(int)SVar5.size_);
        if ((iVar3 == 0) ||
           (iVar3 = EVP_DecryptFinal_ex(local_98,plaintext.data_ + len1,&len2), iVar3 == 0)) {
          ERR_clear_error();
        }
        else {
          if (plaintext.size_ < (ulong)((long)len2 + (long)len1)) {
            abort();
          }
          sVar4 = ssl_ticket_aead_success;
          plaintext.size_ = (long)len2 + (long)len1;
          Array<unsigned_char>::operator=(this_00,&plaintext);
        }
      }
      else {
        sVar4 = ssl_ticket_aead_error;
      }
    }
    Array<unsigned_char>::~Array(&plaintext);
    return sVar4;
  }
  __assert_fail("mac_len == ticket_mac.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0x10a7,
                "enum ssl_ticket_aead_result_t bssl::decrypt_ticket_with_cipher_ctx(Array<uint8_t> *, EVP_CIPHER_CTX *, HMAC_CTX *, Span<const uint8_t>)"
               );
}

Assistant:

static enum ssl_ticket_aead_result_t decrypt_ticket_with_cipher_ctx(
    Array<uint8_t> *out, EVP_CIPHER_CTX *cipher_ctx, HMAC_CTX *hmac_ctx,
    Span<const uint8_t> ticket) {
  size_t iv_len = EVP_CIPHER_CTX_iv_length(cipher_ctx);

  // Check the MAC at the end of the ticket.
  uint8_t mac[EVP_MAX_MD_SIZE];
  size_t mac_len = HMAC_size(hmac_ctx);
  if (ticket.size() < SSL_TICKET_KEY_NAME_LEN + iv_len + 1 + mac_len) {
    // The ticket must be large enough for key name, IV, data, and MAC.
    return ssl_ticket_aead_ignore_ticket;
  }
  // Split the ticket into the ticket and the MAC.
  auto ticket_mac = ticket.last(mac_len);
  ticket = ticket.first(ticket.size() - mac_len);
  HMAC_Update(hmac_ctx, ticket.data(), ticket.size());
  HMAC_Final(hmac_ctx, mac, NULL);
  assert(mac_len == ticket_mac.size());
  bool mac_ok = CRYPTO_memcmp(mac, ticket_mac.data(), mac_len) == 0;
  if (CRYPTO_fuzzer_mode_enabled()) {
    mac_ok = true;
  }
  if (!mac_ok) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Decrypt the session data.
  auto ciphertext = ticket.subspan(SSL_TICKET_KEY_NAME_LEN + iv_len);
  Array<uint8_t> plaintext;
  if (CRYPTO_fuzzer_mode_enabled()) {
    if (!plaintext.CopyFrom(ciphertext)) {
      return ssl_ticket_aead_error;
    }
  } else {
    if (ciphertext.size() >= INT_MAX) {
      return ssl_ticket_aead_ignore_ticket;
    }
    if (!plaintext.InitForOverwrite(ciphertext.size())) {
      return ssl_ticket_aead_error;
    }
    int len1, len2;
    if (!EVP_DecryptUpdate(cipher_ctx, plaintext.data(), &len1,
                           ciphertext.data(), (int)ciphertext.size()) ||
        !EVP_DecryptFinal_ex(cipher_ctx, plaintext.data() + len1, &len2)) {
      ERR_clear_error();
      return ssl_ticket_aead_ignore_ticket;
    }
    plaintext.Shrink(static_cast<size_t>(len1) + len2);
  }

  *out = std::move(plaintext);
  return ssl_ticket_aead_success;
}